

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  cmGeneratorTarget *this;
  undefined8 __p;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *value;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar4;
  string *psVar5;
  pointer ppcVar6;
  char *value_00;
  ostream *poVar7;
  string *psVar8;
  pair<bool,_const_char_*> pVar9;
  string reportEntry;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  ostringstream e;
  bool local_29e;
  undefined1 local_290 [32];
  string *local_270;
  _Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false> local_268;
  string local_260;
  string local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  char *local_208;
  pointer local_200;
  pointer local_1f8;
  cmAlphaNum local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [376];
  
  local_208 = defaultValue;
  value = getTypedProperty<char_const*>(tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_1c0,tgt);
  bVar1 = cm::
          contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1c0,p);
  bVar2 = cm::
          contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&tgt->LinkImplicitNullProperties,p);
  if (bVar1 && bVar2) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x17f5,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  pvVar4 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar4->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar4->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_1a8._0_8_ = &DAT_0000000b;
    local_1a8._8_8_ = " * Target \"";
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    local_1f0.View_._M_str = (psVar5->_M_dataplus)._M_p;
    local_1f0.View_._M_len = psVar5->_M_string_length;
    cmStrCat<>(&local_260,(cmAlphaNum *)local_1a8,&local_1f0);
    if (bVar1) {
      std::__cxx11::string::append((char *)&local_260);
      valueAsString<char_const*>((string *)local_1a8,value);
      std::__cxx11::string::append((string *)&local_260);
      std::__cxx11::string::~string((string *)local_1a8);
    }
    std::__cxx11::string::append((char *)&local_260);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0,
                   "INTERFACE_",p);
    local_268._M_head_impl = (cmGeneratorExpressionInterpreter *)0x0;
    bVar3 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    if (bVar3) {
      local_290._0_8_ = tgt->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                 (cmGeneratorTarget **)config);
      __p = local_1a8._0_8_;
      local_1a8._0_8_ = (pointer)0x0;
      std::
      __uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::reset((__uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
               *)&local_268,(pointer)__p);
      std::
      unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::~unique_ptr((unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                     *)local_1a8);
    }
    ppcVar6 = (pvVar4->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_200 = (pvVar4->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_29e = bVar1;
    local_270 = p;
    while( true ) {
      psVar5 = local_270;
      if (ppcVar6 == local_200) break;
      this = *ppcVar6;
      local_1f8 = ppcVar6;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_220,this);
      bVar3 = cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_220,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1f0);
      value_00 = getTypedProperty<char_const*>(this,(string *)&local_1f0,local_268._M_head_impl);
      local_290._0_8_ = local_290 + 0x10;
      local_290._8_8_ = 0;
      local_290[0x10] = '\0';
      if (bVar3) {
        std::__cxx11::string::append(local_290);
        cmGeneratorTarget::GetName_abi_cxx11_(this);
        std::__cxx11::string::append((string *)local_290);
        std::__cxx11::string::append(local_290);
        valueAsString<char_const*>((string *)local_1a8,value_00);
        std::__cxx11::string::append((string *)local_290);
        std::__cxx11::string::~string((string *)local_1a8);
        std::__cxx11::string::append((char *)local_290);
        if (bVar1) {
          pVar9 = consistentProperty<char_const*>(value,value_00,t);
          std::__cxx11::string::append((string *)&local_260);
          compatibilityAgree_abi_cxx11_((string *)local_1a8,t,value != pVar9.second);
          std::__cxx11::string::append((string *)&local_260);
          std::__cxx11::string::~string((string *)local_1a8);
          value_00 = pVar9.second;
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar7 = std::operator<<((ostream *)local_1a8,"Property ");
            psVar5 = local_270;
            poVar7 = std::operator<<(poVar7,(string *)local_270);
            poVar7 = std::operator<<(poVar7," on target \"");
            psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar7 = std::operator<<(poVar7,(string *)psVar8);
            poVar7 = std::operator<<(poVar7,"\" does\nnot match the INTERFACE_");
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            poVar7 = std::operator<<(poVar7," property requirement\nof dependency \"");
            psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this);
            poVar7 = std::operator<<(poVar7,(string *)psVar8);
            std::operator<<(poVar7,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_240);
LAB_0035358f:
            std::__cxx11::string::~string((string *)&local_240);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::__cxx11::string::~string((string *)local_290);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_220);
            break;
          }
        }
        else if (bVar2) {
          pVar9 = consistentProperty<char_const*>("",value_00,t);
          std::__cxx11::string::append((string *)&local_260);
          compatibilityAgree_abi_cxx11_((string *)local_1a8,t,pVar9.second != "");
          std::__cxx11::string::append((string *)&local_260);
          std::__cxx11::string::~string((string *)local_1a8);
          value_00 = pVar9.second;
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar7 = std::operator<<((ostream *)local_1a8,"Property ");
            psVar5 = local_270;
            value = "";
            poVar7 = std::operator<<(poVar7,(string *)local_270);
            poVar7 = std::operator<<(poVar7," on target \"");
            psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar7 = std::operator<<(poVar7,(string *)psVar8);
            poVar7 = std::operator<<(poVar7,"\" is\nimplied to be ");
            poVar7 = std::operator<<(poVar7,local_208);
            poVar7 = std::operator<<(poVar7,
                                     " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                    );
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            poVar7 = std::operator<<(poVar7," property on\ndependency \"");
            psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this);
            poVar7 = std::operator<<(poVar7,(string *)psVar8);
            std::operator<<(poVar7,"\" is in conflict.\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_240);
            goto LAB_0035358f;
          }
        }
        else if (local_29e == false) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_290,"(Interface set)\n");
          std::__cxx11::string::append((string *)&local_260);
          std::__cxx11::string::~string((string *)local_1a8);
          local_29e = true;
        }
        else {
          pVar9 = consistentProperty<char_const*>(value,value_00,t);
          std::__cxx11::string::append((string *)&local_260);
          compatibilityAgree_abi_cxx11_((string *)local_1a8,t,value != pVar9.second);
          std::__cxx11::string::append((string *)&local_260);
          std::__cxx11::string::~string((string *)local_1a8);
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar7 = std::operator<<((ostream *)local_1a8,"The INTERFACE_");
            psVar5 = local_270;
            poVar7 = std::operator<<(poVar7,(string *)local_270);
            poVar7 = std::operator<<(poVar7," property of \"");
            psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this);
            poVar7 = std::operator<<(poVar7,(string *)psVar8);
            poVar7 = std::operator<<(poVar7,"\" does\nnot agree with the value of ");
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            poVar7 = std::operator<<(poVar7," already determined\nfor \"");
            psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar7 = std::operator<<(poVar7,(string *)psVar8);
            std::operator<<(poVar7,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_240);
            goto LAB_0035358f;
          }
          local_29e = true;
          value_00 = pVar9.second;
        }
      }
      else {
        value_00 = value;
        if (bVar2) {
          value_00 = "";
        }
        if (bVar1) {
          value_00 = value;
        }
      }
      value = value_00;
      std::__cxx11::string::~string((string *)local_290);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_220);
      ppcVar6 = local_1f8 + 1;
    }
    valueAsString<char_const*>((string *)local_1a8,value);
    compatibilityType_abi_cxx11_((string *)local_290,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (tgt,psVar5,(string *)local_1a8,&local_260,(string *)local_290);
    std::__cxx11::string::~string((string *)local_290);
    std::__cxx11::string::~string((string *)local_1a8);
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr((unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                   *)&local_268);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_260);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  return value;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}